

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_Cone.cpp
# Opt level: O0

Point3 * __thiscall
sch::S_Cone::l_Support(Point3 *__return_storage_ptr__,S_Cone *this,Vector3 *v,int *param_2)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double local_80;
  double local_78;
  double local_70;
  Scalar normInverse;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  Scalar norm;
  int *param_2_local;
  Vector3 *v_local;
  S_Cone *this_local;
  
  norm = (Scalar)param_2;
  param_2_local = (int *)v;
  v_local = (Vector3 *)this;
  pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[](v,0);
  dVar1 = *pdVar3;
  pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                     ((Vector3T<double,_false> *)param_2_local,0);
  dVar4 = *pdVar3;
  pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                     ((Vector3T<double,_false> *)param_2_local,1);
  dVar2 = *pdVar3;
  pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                     ((Vector3T<double,_false> *)param_2_local,1);
  local_28 = sqrt(dVar1 * dVar4 + dVar2 * *pdVar3);
  if (2.220446049250313e-16 <= local_28) {
    pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                       ((Vector3T<double,_false> *)param_2_local,2);
    if (-this->angleTan_ * local_28 <= *pdVar3) {
      dVar4 = 1.0 / local_28;
      local_70 = dVar4;
      pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)param_2_local,0);
      dVar1 = local_70;
      local_78 = dVar4 * *pdVar3 * this->baseRadius_;
      pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                         ((Vector3T<double,_false> *)param_2_local,1);
      local_80 = dVar1 * *pdVar3 * this->baseRadius_;
      CD_Matrix::Vector3T<double,_false>::Vector3T
                (__return_storage_ptr__,&local_78,&local_80,&this->height_);
    }
    else {
      local_58 = 0.0;
      local_60 = 0.0;
      normInverse = 0.0;
      CD_Matrix::Vector3T<double,_false>::Vector3T
                (__return_storage_ptr__,&local_58,&local_60,&normInverse);
    }
  }
  else {
    pdVar3 = CD_Matrix::Vector3T<double,_false>::operator[]
                       ((Vector3T<double,_false> *)param_2_local,2);
    if (*pdVar3 < 0.0) {
      local_40 = 0.0;
      local_48 = 0.0;
      local_50 = 0.0;
      CD_Matrix::Vector3T<double,_false>::Vector3T
                (__return_storage_ptr__,&local_40,&local_48,&local_50);
    }
    else {
      local_30 = 0.0;
      local_38 = 0.0;
      CD_Matrix::Vector3T<double,_false>::Vector3T
                (__return_storage_ptr__,&local_30,&local_38,&this->height_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Point3 S_Cone::l_Support(const Vector3 & v, int & /*lastFeature*/) const
{
  Scalar norm = sqrt(v[0] * v[0] + v[1] * v[1]);
  if(norm < sch::epsilon)
  {
    if(v[2] >= 0)
    {
      return Point3(0., 0., height_);
    }
    else
    {
      return Point3(0., 0., 0.);
    }
  }
  else
  {
    if(v[2] < -angleTan_ * norm)
    {
      return Point3(0., 0., 0.);
    }
    else
    {
      Scalar normInverse = 1 / norm;
      return Point3(normInverse * v[0] * baseRadius_, normInverse * v[1] * baseRadius_, height_);
    }
  }
}